

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

vector<double,_std::allocator<double>_> *
mult_matrix_on_constant<double>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<double,_std::allocator<double>_> *a,double *C)

{
  pointer pdVar1;
  pointer pdVar2;
  ulong uVar3;
  uint uVar4;
  allocator_type local_29;
  
  uVar4 = (uint)((ulong)((long)(a->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(a->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_start) >> 3);
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(long)(int)uVar4,&local_29);
  if (0 < (int)uVar4) {
    pdVar1 = (a->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = 0;
    do {
      pdVar2[uVar3] = pdVar1[uVar3] * *C;
      uVar3 = uVar3 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> mult_matrix_on_constant(const std::vector<T>& a, const T& C){
    int n = a.size();
    std::vector<T> ans(n);
    for (int i = 0; i < n; ++i)
        ans[i] = a[i]*C;
    return ans;
}